

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSources::DeleteOwnSSRC(RTPSources *this)

{
  uint uVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  HashElement *pHVar5;
  RTPInternalSourceData *pRVar6;
  
  pRVar6 = this->owndata;
  if (pRVar6 == (RTPInternalSourceData *)0x0) {
    return -0x42;
  }
  uVar1 = (pRVar6->super_RTPSourceData).ssrc;
  pHVar5 = (this->sourcelist).table[uVar1 % 0x207d];
  do {
    (this->sourcelist).curhashelem = pHVar5;
    if (pHVar5 == (HashElement *)0x0) {
LAB_0011d094:
      this->totalcount = this->totalcount + -1;
      if ((pRVar6->super_RTPSourceData).issender == true) {
        this->sendercount = this->sendercount + -1;
      }
      if (((pRVar6->super_RTPSourceData).validated == true) &&
         (((pRVar6->super_RTPSourceData).receivedbye & 1U) == 0)) {
        this->activecount = this->activecount + -1;
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this);
      pRVar6 = this->owndata;
      pRVar4 = (this->super_RTPMemoryObject).mgr;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        if (pRVar6 != (RTPInternalSourceData *)0x0) {
          (*(pRVar6->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])(pRVar6);
        }
      }
      else {
        (**(pRVar6->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(pRVar6);
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pRVar6);
      }
      this->owndata = (RTPInternalSourceData *)0x0;
      return 0;
    }
    if (pHVar5->key == uVar1) {
      pHVar2 = pHVar5->hashprev;
      pHVar3 = pHVar5->hashnext;
      if (pHVar2 == (HashElement *)0x0) {
        (this->sourcelist).table[pHVar5->hashindex] = pHVar3;
      }
      else {
        pHVar2->hashnext = pHVar3;
      }
      if (pHVar3 != (HashElement *)0x0) {
        pHVar3->hashprev = pHVar2;
      }
      pHVar5 = (this->sourcelist).curhashelem;
      pHVar2 = pHVar5->listprev;
      pHVar3 = pHVar5->listnext;
      if (pHVar2 == (HashElement *)0x0) {
        (this->sourcelist).firsthashelem = pHVar3;
        if (pHVar3 == (HashElement *)0x0) {
          (this->sourcelist).lasthashelem = (HashElement *)0x0;
        }
        else {
          pHVar3->listprev = (HashElement *)0x0;
        }
      }
      else {
        pHVar2->listnext = pHVar3;
        if (pHVar3 == (HashElement *)0x0) {
          (this->sourcelist).lasthashelem = pHVar2;
        }
        else {
          pHVar3->listprev = pHVar2;
        }
      }
      pRVar4 = (this->sourcelist).super_RTPMemoryObject.mgr;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar5,0x30);
      }
      else {
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar5);
      }
      (this->sourcelist).curhashelem = pHVar3;
      pRVar6 = this->owndata;
      goto LAB_0011d094;
    }
    pHVar5 = pHVar5->hashnext;
  } while( true );
}

Assistant:

int RTPSources::DeleteOwnSSRC()
{
	if (owndata == 0)
		return ERR_RTP_SOURCES_DONTHAVEOWNSSRC;

	uint32_t ssrc = owndata->GetSSRC();

	sourcelist.GotoElement(ssrc);
	sourcelist.DeleteCurrentElement();

	totalcount--;
	if (owndata->IsSender())
		sendercount--;
	if (owndata->IsActive())
		activecount--;

	OnRemoveSource(owndata);
	
	RTPDelete(owndata,GetMemoryManager());
	owndata = 0;
	return 0;
}